

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O1

void __thiscall tinyusdz::Property::Property(Property *this,Relationship *r,bool custom)

{
  Attribute::Attribute(&this->_attrib);
  this->_listOpQual = ResetToExplicit;
  this->_type = EmptyAttrib;
  (this->_rel).type = r->type;
  Path::Path(&(this->_rel).targetPath,&r->targetPath);
  std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
            (&(this->_rel).targetPathVector,&r->targetPathVector);
  (this->_rel).listOpQual = r->listOpQual;
  AttrMetas::AttrMetas(&(this->_rel)._metas,&r->_metas);
  (this->_rel)._varying_authored = r->_varying_authored;
  (this->_prop_value_type_name)._M_dataplus._M_p = (pointer)&(this->_prop_value_type_name).field_2;
  (this->_prop_value_type_name)._M_string_length = 0;
  (this->_prop_value_type_name).field_2._M_local_buf[0] = '\0';
  this->_has_custom = custom;
  this->_type = Relation;
  this->_listOpQual = r->listOpQual;
  return;
}

Assistant:

Property(const Relationship &r, bool custom = false)
      : _rel(r), _has_custom(custom) {
    _type = Type::Relation;
    set_listedit_qual(r.get_listedit_qual());
  }